

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::ElementsTable::GetRGB
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ElementsTable *this,
          int atomicnum)

{
  pointer ppEVar1;
  double local_28;
  
  if (this->init_ == false) {
    Init(this);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,3);
  if ((atomicnum < 0) ||
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3) <=
     atomicnum)) {
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
  }
  else {
    local_28 = ppEVar1[(uint)atomicnum]->red_;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
    local_28 = (this->elements_).
               super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)atomicnum]->green_;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
    local_28 = (this->elements_).
               super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)atomicnum]->blue_;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> ElementsTable::GetRGB(int atomicnum) {
    if (!init_) Init();

    std::vector<RealType> colors;
    colors.reserve(3);

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size())) {
      colors.push_back(0.0);
      colors.push_back(0.0);
      colors.push_back(0.0);
      return (colors);
    }

    colors.push_back(elements_[atomicnum]->GetRed());
    colors.push_back(elements_[atomicnum]->GetGreen());
    colors.push_back(elements_[atomicnum]->GetBlue());

    return (colors);
  }